

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baillie_test.hpp
# Opt level: O0

int D_chooser(int candidate)

{
  int iVar1;
  undefined4 local_10;
  int D;
  int candidate_local;
  
  local_10 = 5;
  while( true ) {
    iVar1 = jacobiSymbol(local_10,candidate);
    if (iVar1 == -1) break;
    if (local_10 < 1) {
      local_10 = -2;
    }
    else {
      local_10 = local_10 + 2;
    }
    local_10 = -local_10;
  }
  return local_10;
}

Assistant:

int D_chooser(int candidate) {
    int D = 5;
    while ( jacobiSymbol(D, candidate) != -1 ){
        if (D > 0 ) {
            D +=2;
        }else {
            D = -2;
        }
        D *= -1;
    }
    return D;
}